

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownFormats.h
# Opt level: O1

Item * __thiscall jbcoin::KnownFormats<int>::add(KnownFormats<int> *this,char *name,int type)

{
  mapped_type pIVar1;
  Item *this_00;
  mapped_type *ppIVar2;
  mapped_type *ppIVar3;
  _Head_base<0UL,_jbcoin::KnownFormats<int>::Item_*,_false> local_30;
  int local_24;
  
  this_00 = (Item *)operator_new(0x58);
  Item::Item(this_00,name,type);
  local_30._M_head_impl = this_00;
  std::
  vector<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>>
  ::
  emplace_back<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>
            ((vector<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>,std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,std::default_delete<jbcoin::KnownFormats<int>::Item>>>>
              *)&this->m_formats,
             (unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
              *)&local_30);
  if (local_30._M_head_impl != (Item *)0x0) {
    std::default_delete<jbcoin::KnownFormats<int>::Item>::operator()
              ((default_delete<jbcoin::KnownFormats<int>::Item> *)&local_30,local_30._M_head_impl);
  }
  pIVar1 = (this->m_formats).
           super__Vector_base<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>,_std::allocator<std::unique_ptr<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<jbcoin::KnownFormats<int>::Item,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
           ._M_t.
           super__Tuple_impl<0UL,_jbcoin::KnownFormats<int>::Item_*,_std::default_delete<jbcoin::KnownFormats<int>::Item>_>
           .super__Head_base<0UL,_jbcoin::KnownFormats<int>::Item_*,_false>._M_head_impl;
  (**this->_vptr_KnownFormats)(this,pIVar1);
  local_24 = pIVar1->m_type;
  ppIVar2 = std::
            map<int,_jbcoin::KnownFormats<int>::Item_*,_std::less<int>,_std::allocator<std::pair<const_int,_jbcoin::KnownFormats<int>::Item_*>_>_>
            ::operator[](&this->m_types,&local_24);
  *ppIVar2 = pIVar1;
  ppIVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<int>::Item_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::KnownFormats<int>::Item_*>_>_>
            ::operator[](&this->m_names,&pIVar1->m_name);
  *ppIVar3 = pIVar1;
  return pIVar1;
}

Assistant:

Item& add (char const* name, KeyType type)
    {
        m_formats.emplace_back (
            std::make_unique <Item> (name, type));
        auto& item (*m_formats.back());

        addCommonFields (item);

        m_types [item.getType ()] = &item;
        m_names [item.getName ()] = &item;

        return item;
    }